

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_copy_filter_module.c
# Opt level: O2

ngx_int_t ngx_http_copy_filter(ngx_http_request_t *r,ngx_chain_t *in)

{
  byte bVar1;
  ngx_connection_t *pnVar2;
  ngx_int_t *pnVar3;
  void *pvVar4;
  ngx_buf_t *pnVar5;
  size_t sVar6;
  ngx_uint_t nVar7;
  ngx_int_t nVar8;
  ngx_output_chain_ctx_t *ctx;
  byte bVar9;
  byte bVar10;
  
  pnVar2 = r->connection;
  if ((pnVar2->log->log_level & 0x100) != 0) {
    ngx_log_error_core(8,pnVar2->log,0,"http copy filter: \"%V?%V\"",&r->uri,&r->args);
  }
  ctx = (ngx_output_chain_ctx_t *)r->ctx[ngx_http_copy_filter_module.ctx_index];
  if (ctx == (ngx_output_chain_ctx_t *)0x0) {
    ctx = (ngx_output_chain_ctx_t *)ngx_pcalloc(r->pool,0x68);
    nVar7 = ngx_http_copy_filter_module.ctx_index;
    if (ctx == (ngx_output_chain_ctx_t *)0x0) {
      return -1;
    }
    r->ctx[ngx_http_copy_filter_module.ctx_index] = ctx;
    pnVar3 = (ngx_int_t *)r->loc_conf[nVar7];
    pvVar4 = r->loc_conf[ngx_http_core_module.ctx_index];
    bVar9 = (byte)(*(uint *)&pnVar2->field_0xd8 >> 0x12) & 1;
    bVar1 = ctx->field_0x20;
    ctx->field_0x20 = bVar1 & 0xfe | bVar9;
    bVar10 = 8;
    if ((*(uint *)&r->field_0x468 >> 0x1d & 1) == 0) {
      bVar10 = (byte)(*(uint *)&r->field_0x468 >> 0x1b) & 8;
    }
    ctx->field_0x20 = bVar1 & 0xf6 | bVar9 | bVar10;
    ctx->field_0x20 =
         bVar1 & 0xe6 | bVar9 | bVar10 | (byte)((uint)*(undefined4 *)&r->field_0x468 >> 0x1b) & 0x10
    ;
    ctx->alignment = *(off_t *)((long)pvVar4 + 0xc0);
    ctx->pool = r->pool;
    sVar6 = pnVar3[1];
    (ctx->bufs).num = *pnVar3;
    (ctx->bufs).size = sVar6;
    ctx->tag = &ngx_http_copy_filter_module;
    ctx->output_filter = (ngx_output_chain_filter_pt)ngx_http_next_body_filter;
    ctx->filter_ctx = r;
    if ((in != (ngx_chain_t *)0x0) && (pnVar5 = in->buf, pnVar5 != (ngx_buf_t *)0x0)) {
      if ((pnVar5->field_0x48 & 7) == 0) {
        if (pnVar5->file_last == pnVar5->file_pos) goto LAB_0015ee7a;
      }
      else if (pnVar5->last == pnVar5->pos) goto LAB_0015ee7a;
      r->field_0x46a = r->field_0x46a | 8;
    }
  }
LAB_0015ee7a:
  nVar8 = ngx_output_chain(ctx,in);
  *(ulong *)&r->field_0x468 =
       (ulong)((uint)(ctx->in != (ngx_chain_t *)0x0) << 0x1b) |
       *(ulong *)&r->field_0x468 & 0xfffffffff7ffffff;
  if ((pnVar2->log->log_level & 0x100) != 0) {
    ngx_log_error_core(8,pnVar2->log,0,"http copy filter: %i \"%V?%V\"",nVar8,&r->uri,&r->args);
  }
  return nVar8;
}

Assistant:

static ngx_int_t
ngx_http_copy_filter(ngx_http_request_t *r, ngx_chain_t *in)
{
    ngx_int_t                     rc;
    ngx_connection_t             *c;
    ngx_output_chain_ctx_t       *ctx;
    ngx_http_core_loc_conf_t     *clcf;
    ngx_http_copy_filter_conf_t  *conf;

    c = r->connection;

    ngx_log_debug2(NGX_LOG_DEBUG_HTTP, c->log, 0,
                   "http copy filter: \"%V?%V\"", &r->uri, &r->args);

    ctx = ngx_http_get_module_ctx(r, ngx_http_copy_filter_module);

    if (ctx == NULL) {
        ctx = ngx_pcalloc(r->pool, sizeof(ngx_output_chain_ctx_t));
        if (ctx == NULL) {
            return NGX_ERROR;
        }

        ngx_http_set_ctx(r, ctx, ngx_http_copy_filter_module);

        conf = ngx_http_get_module_loc_conf(r, ngx_http_copy_filter_module);
        clcf = ngx_http_get_module_loc_conf(r, ngx_http_core_module);

        ctx->sendfile = c->sendfile;
        ctx->need_in_memory = r->main_filter_need_in_memory
                              || r->filter_need_in_memory;
        ctx->need_in_temp = r->filter_need_temporary;

        ctx->alignment = clcf->directio_alignment;

        ctx->pool = r->pool;
        ctx->bufs = conf->bufs;
        ctx->tag = (ngx_buf_tag_t) &ngx_http_copy_filter_module;

        ctx->output_filter = (ngx_output_chain_filter_pt)
                                  ngx_http_next_body_filter;
        ctx->filter_ctx = r;

#if (NGX_HAVE_FILE_AIO)
        if (ngx_file_aio && clcf->aio == NGX_HTTP_AIO_ON) {
            ctx->aio_handler = ngx_http_copy_aio_handler;
#if (NGX_HAVE_AIO_SENDFILE)
            ctx->aio_preload = ngx_http_copy_aio_sendfile_preload;
#endif
        }
#endif

#if (NGX_THREADS)
        if (clcf->aio == NGX_HTTP_AIO_THREADS) {
            ctx->thread_handler = ngx_http_copy_thread_handler;
        }
#endif

        if (in && in->buf && ngx_buf_size(in->buf)) {
            r->request_output = 1;
        }
    }

#if (NGX_HAVE_FILE_AIO || NGX_THREADS)
    ctx->aio = r->aio;
#endif

    rc = ngx_output_chain(ctx, in);

    if (ctx->in == NULL) {
        r->buffered &= ~NGX_HTTP_COPY_BUFFERED;

    } else {
        r->buffered |= NGX_HTTP_COPY_BUFFERED;
    }

    ngx_log_debug3(NGX_LOG_DEBUG_HTTP, c->log, 0,
                   "http copy filter: %i \"%V?%V\"", rc, &r->uri, &r->args);

    return rc;
}